

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QHash<int,_QVariant>_>::resize(QList<QHash<int,_QVariant>_> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  QHash<int,_QVariant> *pQVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QHash<int,_QVariant>_>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QHash<int,_QVariant> **)0x0,
               (QArrayDataPointer<QHash<int,_QVariant>_> *)0x0);
  }
  else {
    lVar2 = (this->d).size;
    if (size < lVar2) {
      pQVar3 = (this->d).ptr + size;
      lVar2 = lVar2 * 8 + size * -8;
      do {
        QHash<int,_QVariant>::~QHash(pQVar3);
        pQVar3 = pQVar3 + 1;
        lVar2 = lVar2 + -8;
      } while (lVar2 != 0);
      (this->d).size = size;
    }
  }
  lVar2 = (this->d).size;
  if (lVar2 < size) {
    pQVar3 = (this->d).ptr;
    lVar2 = lVar2 << 3;
    do {
      *(undefined8 *)((long)&pQVar3->d + lVar2) = 0;
      lVar2 = lVar2 + 8;
    } while (size * 8 - lVar2 != 0);
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }